

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

char * get_char_color(CHAR_DATA *ch,char *event)

{
  CHAR_DATA *pCVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  
  uVar4 = get_event_number(event);
  if ((ch->comm[0] & 0x40000000) == 0) {
    if ((ch->desc != (DESCRIPTOR_DATA *)0x0) &&
       (pCVar1 = ch->desc->original, pCVar1 != (CHAR_DATA *)0x0)) {
      ch = pCVar1;
    }
    bVar3 = is_npc(ch);
    pcVar7 = "";
    if ((!bVar3) && ((ch->comm[0] & 0x400) != 0)) {
      if (-1 < (int)uVar4) {
        pcVar7 = color_name_to_ascii(ch->pcdata->color_scheme[uVar4]);
        return pcVar7;
      }
      lVar2 = 0;
      do {
        lVar6 = lVar2;
        if (lVar6 + 0x10 == 0x110) {
          return "";
        }
        bVar3 = str_cmp(event,*(char **)((long)&color_table[0].color_name + lVar6));
        lVar2 = lVar6 + 0x10;
      } while (bVar3);
      pcVar7 = *(char **)((long)&color_table[0].color_ascii + lVar6);
    }
  }
  else {
    iVar5 = number_range(0,0xf);
    pcVar7 = color_table[iVar5].color_ascii;
  }
  return pcVar7;
}

Assistant:

char *get_char_color(CHAR_DATA *ch, char *event)
{
	int i = get_event_number(event);

	if (IS_SET(ch->comm, COMM_LOTS_O_COLOR))
		return color_table[number_range(0, MAX_COLORS - 1)].color_ascii;

	if (ch->desc != nullptr && ch->desc->original != nullptr)
		ch = ch->desc->original;

	if (is_npc(ch))
		return "";

	if (!IS_SET(ch->comm, COMM_ANSI))
		return "";

	if (i >= 0)
		return color_name_to_ascii(ch->pcdata->color_scheme[i]);

	for (i = 0; i < MAX_COLORS; i++)
	{
		if (!str_cmp(event, color_table[i].color_name))
			return color_table[i].color_ascii;
	}

	return "";
}